

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O1

bool choosePort<RtMidiOut>(RtMidiOut *rtmidi,char *dir)

{
  uint uVar1;
  ostream *poVar2;
  size_t sVar3;
  string portName;
  uint local_74;
  long *local_70;
  long local_68;
  long local_60 [2];
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = '\0';
  local_74 = 0;
  uVar1 = (**(code **)(*(long *)rtmidi + 0x10))();
  if (uVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No ",3);
    if (dir == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107090);
    }
    else {
      sVar3 = strlen(dir);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,dir,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," ports available!",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  else {
    if (uVar1 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nOpening ",9);
      (**(code **)(*(long *)rtmidi + 0x18))(&local_70,rtmidi,0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_70,local_68);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
    }
    else {
      local_74 = 0;
      do {
        (**(code **)(*(long *)rtmidi + 0x18))((string *)&local_70,rtmidi,local_74);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        if (dir == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107090);
        }
        else {
          sVar3 = strlen(dir);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,dir,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," port #",7);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_50,local_48);
        local_70 = (long *)CONCAT71(local_70._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_70,1);
        local_74 = local_74 + 1;
      } while (local_74 < uVar1);
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nChoose a port number: ",0x17);
        std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
      } while (uVar1 <= local_74);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"RtMidi Output","");
    (*(code *)**(undefined8 **)rtmidi)(rtmidi,local_74,&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return uVar1 != 0;
}

Assistant:

bool choosePort( RT *rtmidi, const char *dir )
{
  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    std::cout << "No " << dir << " ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      std::cout << "  " << dir << " port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
  }

  std::cout << "\n";
  rtmidi->openPort( i );

  return true;
}